

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_linear_resampler_interpolate_frame_s16(ma_linear_resampler *pResampler,ma_int16 *pFrameOut)

{
  uint uVar1;
  ma_int16 s;
  ma_uint32 shift;
  ma_uint32 a;
  ma_uint32 c;
  ma_int16 *pFrameOut_local;
  ma_linear_resampler *pResampler_local;
  ma_int32 r;
  ma_int32 c_1;
  ma_int32 b;
  
  if (pResampler == (ma_linear_resampler *)0x0) {
    __assert_fail("pResampler != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x7f93,
                  "void ma_linear_resampler_interpolate_frame_s16(ma_linear_resampler *, ma_int16 *)"
                 );
  }
  if (pFrameOut != (ma_int16 *)0x0) {
    uVar1 = (pResampler->inTimeFrac << 0xc) / (pResampler->config).sampleRateOut;
    shift = 0;
    while( true ) {
      if ((pResampler->config).channels <= shift) {
        return;
      }
      if (0x1000 < (int)uVar1) break;
      pFrameOut[shift] =
           (ma_int16)
           ((int)((int)*(short *)((long)&pResampler->x0 + (ulong)shift * 2) * (0x1000 - uVar1) +
                 (int)*(short *)((long)&pResampler->x1 + (ulong)shift * 2) * uVar1) >> 0xc);
      shift = shift + 1;
    }
    __assert_fail("a <= (1<<shift)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x7f84,
                  "ma_int16 ma_linear_resampler_mix_s16(ma_int16, ma_int16, ma_int32, const ma_int32)"
                 );
  }
  __assert_fail("pFrameOut != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x7f94,
                "void ma_linear_resampler_interpolate_frame_s16(ma_linear_resampler *, ma_int16 *)")
  ;
}

Assistant:

static void ma_linear_resampler_interpolate_frame_s16(ma_linear_resampler* pResampler, ma_int16* pFrameOut)
{
    ma_uint32 c;
    ma_uint32 a;
    const ma_uint32 shift = 12;

    MA_ASSERT(pResampler != NULL);
    MA_ASSERT(pFrameOut  != NULL);

    a = (pResampler->inTimeFrac << shift) / pResampler->config.sampleRateOut;

    for (c = 0; c < pResampler->config.channels; c += 1) {
        ma_int16 s = ma_linear_resampler_mix_s16(pResampler->x0.s16[c], pResampler->x1.s16[c], a, shift);
        pFrameOut[c] = s;
    }
}